

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

void solve_linear_3x3_system(float *A,float *b,float *ret_x)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  uint uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long unaff_RBP;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 local_38 [8];
  float A_inv [9];
  float fStack_c;
  undefined1 auVar12 [16];
  
  auVar15 = ZEXT816(0) << 0x40;
  uVar5 = 2;
  lVar6 = 0;
  do {
    lVar8 = lVar6 + 1;
    lVar7 = 0;
    if (lVar6 != 2) {
      lVar7 = lVar8;
    }
    auVar1 = vfmsub231ss_fma(ZEXT416((uint)(A[lVar7 + 6] * A[(uVar5 / 3) * -3 + lVar6 + 5])),
                             ZEXT416((uint)A[lVar7 + 3]),
                             ZEXT416((uint)A[(uVar5 / 3) * -3 + lVar6 + 8]));
    auVar15 = vfmadd231ss_fma(auVar15,auVar1,ZEXT416((uint)A[lVar6]));
    uVar5 = uVar5 + 1;
    lVar6 = lVar8;
  } while (lVar8 != 3);
  fVar14 = 1.0 / auVar15._0_4_;
  uVar3 = 2;
  lVar6 = -0x24;
  auVar15 = vpmovsxbd_avx(ZEXT416(0xc000603));
  auVar1 = vpmovsxbd_avx(ZEXT416(0x6030006));
  do {
    auVar9 = vpbroadcastd_avx512vl();
    auVar10 = vpbroadcastd_avx512vl();
    auVar12 = vpaddd_avx(auVar9,auVar15);
    vpmovzxdq_avx2(auVar12);
    auVar11 = vgatherqps_avx512vl(*(undefined8 *)(A + unaff_RBP));
    vpaddd_avx(auVar10,auVar1);
    auVar12 = vgatherdps_avx512vl(A[unaff_RBP]);
    auVar13._0_12_ = auVar12._0_12_;
    auVar13._12_4_ = 0;
    vpaddd_avx(auVar10,auVar15);
    auVar10 = vgatherdps_avx512vl(*A);
    auVar12 = vpaddd_avx(auVar9,auVar1);
    vpmovzxdq_avx2(auVar12);
    auVar12 = vgatherqps_avx512vl(*(undefined8 *)(A + uVar3 % 3));
    auVar9._0_4_ = auVar12._0_4_ * auVar10._0_4_;
    auVar9._4_4_ = auVar12._4_4_ * auVar10._4_4_;
    auVar9._8_4_ = auVar12._8_4_ * auVar10._8_4_;
    auVar9._12_4_ = auVar12._12_4_ * 0.0;
    auVar12 = vfmsub231ps_fma(auVar9,auVar11,auVar13);
    uVar2 = *(undefined4 *)(&stack0xfffffffffffffff8 + lVar6);
    *(float *)((long)A_inv + lVar6 + 0x1c) = fVar14 * auVar12._0_4_;
    *(float *)((long)A_inv + lVar6 + 0x20) = fVar14 * auVar12._4_4_;
    *(float *)((long)&fStack_c + lVar6) = fVar14 * auVar12._8_4_;
    *(undefined4 *)(&stack0xfffffffffffffff8 + lVar6) = uVar2;
    uVar3 = uVar3 + 1;
    lVar6 = lVar6 + 0xc;
  } while (lVar6 != 0);
  ret_x[0] = 0.0;
  ret_x[1] = 0.0;
  ret_x[2] = 0.0;
  puVar4 = local_38;
  lVar6 = 0;
  do {
    auVar16 = ZEXT464((uint)ret_x[lVar6]);
    lVar8 = 0;
    do {
      auVar15 = vfmadd231ss_fma(auVar16._0_16_,ZEXT416(*(uint *)(puVar4 + lVar8 * 4)),
                                ZEXT416((uint)b[lVar8]));
      auVar16 = ZEXT1664(auVar15);
      ret_x[lVar6] = auVar15._0_4_;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 0xc;
  } while (lVar6 != 3);
  return;
}

Assistant:

void solve_linear_3x3_system(float A[9], float b[3], float ret_x[3]) {

    assert((A != NULL) && (b != NULL) && (ret_x != NULL));

    // computing determinant and inverse determinant of A
    float det = 0.0f;
    for (int i = 0; i < 3; ++i) {
       det += A[0*3 + i] * (A[1*3 + (i+1)%3] * A[2*3 + (i+2)%3] - A[1*3 + (i+2)%3] * A[2*3 + (i+1)%3]);
    }
    float det_inv = 1.0f / det;

    // computing inverse of 3x3 matrix A with inverse determinant
    float A_inv[9];
    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            A_inv[i*3 + j] = det_inv * ((A[((j+1)%3)*3 + (i+1)%3] * A[((j+2)%3)*3 + (i+2)%3]) - (A[((j+1)%3)*3 + (i+2)%3] * A[((j+2)%3)*3 + (i+1)%3]));
        }
    }

    // computing solution vector x = A_inv * b
    ret_x[0] = 0.0f;
    ret_x[1] = 0.0f;
    ret_x[2] = 0.0f;
    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            ret_x[i] += A_inv[i*3 + j] * b[j];
        }
    }

}